

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall Hpipe::Lexer::assemble_larg(Lexer *this,Lexem *o)

{
  Lexem *pLVar1;
  Lexem *pLVar2;
  Source *source;
  char *str;
  
  pLVar1 = o->prev;
  if (pLVar1 == (Lexem *)0x0) {
    if (o == (Lexem *)0x0) {
      source = (Source *)0x0;
    }
    else {
      source = o->source;
    }
    if (o == (Lexem *)0x0) {
      str = (char *)0x0;
    }
    else {
      str = o->beg;
    }
    ErrorList::add(this->error_list,source,str,"Operator needs a left expression.");
  }
  else {
    if (pLVar1->parent != (Lexem *)0x0) {
      o->parent = pLVar1->parent;
      pLVar1->parent->children[pLVar1->parent->children[0] != pLVar1] = o;
    }
    pLVar2 = o->prev;
    if (pLVar2->prev != (Lexem *)0x0) {
      pLVar2->prev->next = o;
    }
    o->children[0] = pLVar2;
    pLVar2->parent = o;
    o->prev = pLVar2->prev;
    o->children[0]->next = (Lexem *)0x0;
    o->children[0]->prev = (Lexem *)0x0;
  }
  return pLVar1 != (Lexem *)0x0;
}

Assistant:

bool Lexer::assemble_larg( Lexem *o ) {
    if ( not o->prev )
        return err( o, "Operator needs a left expression." );
    if ( o->prev->parent ) {
        o->parent = o->prev->parent;
        if (o->prev->parent->children[ 0 ] == o->prev)
            o->prev->parent->children[ 0 ] = o;
        else
            o->prev->parent->children[ 1 ] = o;
    }
    if ( o->prev->prev )
        o->prev->prev->next = o;

    o->children[ 0 ] = o->prev;
    o->children[ 0 ]->parent = o;
    o->prev = o->prev->prev;

    o->children[ 0 ]->next = NULL;
    o->children[ 0 ]->prev = NULL;
    return true;
}